

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

void extendFortress(PieceEnv *env,Piece *p,int offh,int offv,int turn,int corridor)

{
  int depth;
  byte bVar1;
  uint64_t *puVar2;
  bool bVar3;
  bool bVar4;
  Piece *pPVar5;
  int y;
  ulong uVar6;
  uint uVar7;
  int *piVar8;
  int *piVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  uint64_t uVar19;
  char cVar20;
  int local_70;
  
  bVar1 = p->rot;
  uVar17 = 1;
  if (corridor != 0) {
    uVar17 = 7;
  }
  uVar6 = 0xe;
  if (corridor == 0) {
    uVar6 = 7;
  }
  if (turn == -1) {
    iVar10 = (p->bb0).x;
    iVar16 = (p->bb0).z;
    if ((bVar1 & 1) == 0) {
      iVar10 = iVar10 + -1;
      iVar16 = iVar16 + offh;
      local_70 = 3;
    }
    else {
      iVar10 = offh + iVar10;
      iVar16 = iVar16 + -1;
      local_70 = 0;
    }
  }
  else {
    if (turn == 0) {
      (*(code *)(&DAT_0012c5a4 + *(int *)(&DAT_0012c5a4 + (ulong)bVar1 * 4)))
                (&DAT_0012c5a4 + *(int *)(&DAT_0012c5a4 + (ulong)bVar1 * 4));
      return;
    }
    if ((bVar1 & 1) == 0) {
      iVar16 = offh + (p->bb0).z;
      iVar10 = (p->bb1).x + 1;
      local_70 = 1;
    }
    else {
      iVar10 = offh + (p->bb0).x;
      iVar16 = (p->bb1).z + 1;
      local_70 = 2;
    }
  }
  depth = p->depth + 1;
  y = offv + (p->bb0).y;
  uVar11 = iVar10 - (env->list->bb0).x;
  uVar7 = -uVar11;
  if (0 < (int)uVar11) {
    uVar7 = uVar11;
  }
  uVar11 = 0xffffffff;
  if (uVar7 < 0x71) {
    uVar12 = iVar16 - (env->list->bb0).z;
    uVar7 = -uVar12;
    if (0 < (int)uVar12) {
      uVar7 = uVar12;
    }
    if (uVar7 < 0x71) {
      uVar13 = (ulong)uVar17;
      piVar9 = (int *)((long)&fortress_info[0].max + (ulong)(uVar17 * 0x30));
      uVar7 = 0;
      bVar3 = false;
      uVar14 = uVar13;
      do {
        bVar4 = bVar3;
        if ((*piVar9 < 1) || (bVar4 = true, env->ntyp[uVar14] < *piVar9)) {
          bVar3 = bVar4;
          uVar7 = uVar7 + piVar9[-1];
        }
        uVar11 = 0;
        uVar14 = uVar14 + 1;
        piVar9 = piVar9 + 0xc;
      } while (uVar14 < uVar6);
      if (p->depth < '\x1e' && (0 < (int)uVar7 && bVar3)) {
        uVar11 = uVar7 - (uVar7 >> 1 & 0x55555555);
        uVar12 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
        piVar9 = (int *)((long)&fortress_info[0].max + (ulong)(uVar17 * 0x30));
        iVar15 = 0;
        do {
          puVar2 = env->rng;
          uVar19 = *puVar2;
          piVar8 = piVar9;
          uVar14 = uVar13;
          if (((uVar12 >> 4) + uVar12 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2) {
            uVar18 = uVar19 * 0x5deece66d + 0xb & 0xffffffffffff;
            *puVar2 = uVar18;
            uVar18 = (uVar18 >> 0x11) * (ulong)uVar7 >> 0x1f;
          }
          else {
            do {
              uVar19 = uVar19 * 0x5deece66d + 0xb & 0xffffffffffff;
              uVar18 = (uVar19 >> 0x11) % (ulong)uVar7;
            } while (-1 < (int)((int)uVar18 - ((int)(uVar19 >> 0x11) + uVar7)));
            *puVar2 = uVar19;
          }
          do {
            if ((*piVar8 < 1) || (cVar20 = '\f', env->ntyp[uVar14] < *piVar8)) {
              uVar17 = (int)uVar18 - piVar8[-1];
              uVar18 = (ulong)uVar17;
              cVar20 = '\f';
              if ((int)uVar17 < 0) {
                if ((uVar14 == (uint)env->typlast) && (piVar8[-2] == 0)) {
                  cVar20 = '\n';
                }
                else {
                  pPVar5 = addFortressPiece(env,(int)uVar14,iVar10,y,iVar16,depth,local_70,1);
                  cVar20 = pPVar5 != (Piece *)0x0;
                }
              }
            }
            if ((cVar20 != '\0') && (cVar20 != '\f')) {
              if (cVar20 != '\n') {
                return;
              }
              break;
            }
            uVar14 = uVar14 + 1;
            piVar8 = piVar8 + 0xc;
          } while (uVar14 < uVar6);
          iVar15 = iVar15 + 1;
          uVar11 = 0;
        } while (iVar15 != 5);
      }
    }
  }
  addFortressPiece(env,0xe,iVar10,y,iVar16,depth,local_70,~uVar11 >> 0x1f);
  return;
}

Assistant:

static
void extendFortress(PieceEnv *env, Piece *p, int offh, int offv, int turn, int corridor)
{
    int x, y, z, t, i;
    int depth = p->depth + 1;
    int facing = p->rot;
    int typ0 = corridor ? CORRIDOR_STRAIGHT : BRIDGE_STRAIGHT;
    int typ1 = typ0 + (corridor ? 7 : 6);
    int valid = -1;
    int weight_tot = 0;

    y = p->bb0.y + offv;

    if (turn == 0) { // forward
        switch (facing) {
        case 0: x = p->bb0.x+offh; z = p->bb0.z-1;    break;
        case 1: x = p->bb1.x+1;    z = p->bb0.z+offh; break;
        case 2: x = p->bb0.x+offh; z = p->bb1.z+1;    break;
        case 3: x = p->bb0.x-1;    z = p->bb0.z+offh; break;
        default: UNREACHABLE();
        }
    } else if (turn == -1) { // left
        if (facing & 1) { x = p->bb0.x+offh; z = p->bb0.z-1;    facing = 0; }
        else            { x = p->bb0.x-1;    z = p->bb0.z+offh; facing = 3; }
    } else if (turn == +1) { // right
        if (facing & 1) { x = p->bb0.x+offh, z = p->bb1.z+1;    facing = 2; }
        else            { x = p->bb1.x+1;    z = p->bb0.z+offh; facing = 1; }
    } else UNREACHABLE();

    if (IABS(x - env->list->bb0.x) > 112 || IABS(z - env->list->bb0.z) > 112)
        goto L_end;

    for (valid = 0, t = typ0; t < typ1; t++)
    {
        int max = fortress_info[t].max;
        if (max > 0 && env->ntyp[t] >= max)
            continue;
        if (max > 0)
            valid = 1;
        weight_tot += fortress_info[t].weight;
    }

    if (valid == 0 || weight_tot <= 0 || depth > 30)
        goto L_end;

    for (i = 0; i < 5; i++)
    {
        int n = nextInt(env->rng, weight_tot);
        for (t = typ0; t < typ1; t++)
        {
            int max = fortress_info[t].max;
            if (max > 0 && env->ntyp[t] >= max)
                continue;
            n -= fortress_info[t].weight;
            if (n >= 0)
                continue;
            if (env->typlast == t && !fortress_info[t].repeatable)
                break;
            if (addFortressPiece(env, t, x, y, z, depth, facing, 1) != NULL)
                return;
        }
    }

L_end:
    addFortressPiece(env, FORTRESS_END, x, y, z, depth, facing, valid >= 0);
}